

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O1

decimal_fp<float> fmt::v8::detail::dragonbox::to_decimal<float>(float x)

{
  carrier_uint two_f;
  undefined1 auVar1 [16];
  carrier_uint two_f_00;
  bool bVar2;
  byte bVar3;
  char cVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  int minus_k;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  int beta_minus_1;
  uint uVar15;
  cache_entry_type cache;
  ulong local_38;
  
  uVar10 = (uint)x & 0x7fffff;
  if (((uint)x & 0x7f800000) == 0) {
    uVar5 = 0xffffff6b;
    if (uVar10 == 0) {
      uVar14 = 0;
      uVar10 = 0;
      goto LAB_00113d83;
    }
LAB_00113ab6:
    uVar13 = (int)(uVar5 * 0x134413) >> 0x16;
    uVar14 = (ulong)uVar13;
    if (0x4d < 0x20 - uVar13) {
      assert_fail("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/fmt-src/include/fmt/format-inl.h"
                  ,0x41d,"k is out of range");
    }
    minus_k = uVar13 - 1;
    local_38 = *(ulong *)(cache_accessor<float>::get_cached_power(int)::pow10_significands +
                         (ulong)(0x20 - uVar13) * 8);
    beta_minus_1 = ((int)((1 - uVar13) * 0x1a934f) >> 0x13) + uVar5;
    two_f_00 = uVar10 * 2;
    two_f = uVar10 * 2 + 1;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = local_38;
    auVar1 = auVar1 * ZEXT416(two_f << ((byte)beta_minus_1 & 0x1f));
    uVar7 = auVar1._8_8_ * 0x51eb851f;
    uVar8 = uVar7 >> 0x25;
    uVar6 = (uint)(uVar7 >> 0x20);
    uVar12 = (uVar6 >> 5) * -100 + auVar1._8_4_;
    uVar15 = (uint)(local_38 >> (~(byte)beta_minus_1 & 0x3f));
    uVar11 = uVar6 >> 5;
    if (uVar15 < uVar12) {
LAB_00113cfa:
      uVar10 = (uVar12 - (uVar15 >> 1)) + 5;
      if ((uVar10 & 1) == 0) {
        uVar13 = (uVar10 >> 1) * 0xcccd;
        uVar6 = (uVar13 >> 0x12) + uVar11 * 10;
        uVar10 = uVar6;
        if ((uVar13 & 0xfffc) < 0x3334) {
          bVar2 = cache_accessor<float>::compute_mul_parity(two_f_00,&local_38,beta_minus_1);
          if (bVar2) {
            bVar2 = is_center_integer<float>(two_f_00,uVar5,minus_k);
            uVar10 = uVar6 & 0xfffffffe;
            if (!bVar2) {
              uVar10 = uVar6;
            }
          }
          else {
            uVar10 = uVar6 - 1;
          }
        }
      }
      else {
        if (100 < uVar10) {
          assert_fail("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/fmt-src/include/fmt/format-inl.h"
                      ,0x407,"n is too large");
        }
        uVar10 = (uVar10 * 0xcccd >> 0x13) + uVar11 * 10;
      }
      goto LAB_00113d83;
    }
    if (uVar12 < uVar15) {
      if (((uVar12 == 0) && ((uVar10 & 1) != 0)) &&
         (bVar2 = is_endpoint_integer<float>(two_f,uVar5,minus_k), bVar2)) {
        uVar12 = 100;
        uVar11 = (uVar6 >> 5) - 1;
        goto LAB_00113cfa;
      }
    }
    else if ((((uVar10 & 1) != 0) ||
             (bVar2 = is_endpoint_integer<float>(two_f_00 - 1,uVar5,minus_k), !bVar2)) &&
            (bVar2 = cache_accessor<float>::compute_mul_parity(two_f_00 - 1,&local_38,beta_minus_1),
            uVar11 = uVar6 >> 5, !bVar2)) goto LAB_00113cfa;
    uVar5 = uVar6 >> 5 | 0x80;
    uVar10 = 0;
    if (uVar5 != 0) {
      for (; (uVar5 >> uVar10 & 1) == 0; uVar10 = uVar10 + 1) {
      }
    }
    uVar5 = 0;
    uVar6 = uVar6 >> 5;
    if (1 < uVar10) {
      uVar5 = 0;
      do {
        uVar11 = (uint)uVar8 * -0x3d70a3d7;
        uVar6 = (uint)uVar8;
        if (0xa3d70a3 < uVar11) goto LAB_00113ccf;
        uVar5 = uVar5 + 2;
        uVar8 = (ulong)uVar11;
      } while ((int)uVar5 < (int)(uVar10 - 1));
LAB_00113ccb:
      uVar5 = uVar10 & 0xfffffffe;
      uVar6 = uVar11;
    }
  }
  else {
    uVar5 = (((uint)x & 0x7f800000) >> 0x17) - 0x96;
    if (uVar10 != 0) {
      uVar10 = uVar10 | 0x800000;
      goto LAB_00113ab6;
    }
    uVar13 = (int)(uVar5 * 0x134413 + -0x7feff) >> 0x16;
    uVar14 = (ulong)uVar13;
    cVar4 = (char)((int)(uVar13 * -0x1a934f) >> 0x13) + (char)uVar5;
    uVar7 = *(ulong *)(cache_accessor<float>::get_cached_power(int)::pow10_significands +
                      (ulong)(0x1f - uVar13) * 8);
    bVar3 = 0x28 - cVar4;
    uVar10 = (uint)((uVar5 & 0xfffffffe) != 2) + (int)(uVar7 - (uVar7 >> 0x19) >> (bVar3 & 0x3f));
    uVar8 = (uVar7 >> 0x18) + uVar7 >> (bVar3 & 0x3f) & 0xffffffff;
    uVar9 = uVar8 / 10;
    uVar6 = (uint)uVar9;
    if ((uint)((int)(uVar8 / 10) * 10) < uVar10) {
      uVar13 = (int)(uVar7 >> (0x27U - cVar4 & 0x3f)) + 1U >> 1;
      if (uVar5 == 0xffffffdd) {
        uVar10 = uVar13 & 0xfffffffe;
      }
      else {
        uVar10 = uVar13 + (uVar13 < uVar10);
      }
      goto LAB_00113d83;
    }
    uVar5 = (uint)(uVar8 / 10) | 0x80;
    uVar10 = 0;
    if (uVar5 != 0) {
      for (; (uVar5 >> uVar10 & 1) == 0; uVar10 = uVar10 + 1) {
      }
    }
    uVar5 = 0;
    if (1 < uVar10) {
      uVar5 = 0;
      do {
        uVar6 = (uint)uVar9;
        uVar11 = uVar6 * -0x3d70a3d7;
        if (0xa3d70a3 < uVar11) goto LAB_00113ccf;
        uVar5 = uVar5 + 2;
        uVar9 = (ulong)uVar11;
      } while ((int)uVar5 < (int)(uVar10 - 1));
      goto LAB_00113ccb;
    }
  }
LAB_00113ccf:
  if (uVar5 < uVar10) {
    uVar10 = uVar6 * -0x33333333;
    if (uVar10 < 0x33333334) {
      uVar6 = uVar10;
    }
    uVar5 = uVar5 | uVar10 < 0x33333334;
  }
  uVar14 = (ulong)(uVar13 + 1 + uVar5);
  uVar10 = uVar6 >> ((byte)uVar5 & 0x1f);
LAB_00113d83:
  return (decimal_fp<float>)((ulong)uVar10 | uVar14 << 0x20);
}

Assistant:

FMT_CONSTEXPR fp normalize(fp value) {
  // Handle subnormals.
  const uint64_t implicit_bit = 1ULL << num_significand_bits<double>();
  const auto shifted_implicit_bit = implicit_bit << SHIFT;
  while ((value.f & shifted_implicit_bit) == 0) {
    value.f <<= 1;
    --value.e;
  }
  // Subtract 1 to account for hidden bit.
  const auto offset =
      fp::num_significand_bits - num_significand_bits<double>() - SHIFT - 1;
  value.f <<= offset;
  value.e -= offset;
  return value;
}